

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

uint rotateModulo(uint BitWidth,APInt *rotateAmt)

{
  uint uVar1;
  bool bVar2;
  uint64_t uVar3;
  ulong __n;
  APInt rot;
  anon_union_8_2_1313ab2f_for_U local_58;
  uint local_50;
  anon_union_8_2_1313ab2f_for_U local_48;
  uint local_40;
  anon_union_8_2_1313ab2f_for_U local_38;
  uint local_30;
  
  uVar1 = rotateAmt->BitWidth;
  local_50 = uVar1;
  if ((ulong)uVar1 < 0x41) {
    local_58 = rotateAmt->U;
  }
  else {
    __n = (ulong)((uint)((ulong)uVar1 + 0x3f >> 3) & 0xfffffff8);
    local_58.pVal = (uint64_t *)operator_new__(__n);
    memcpy(local_58.pVal,(rotateAmt->U).pVal,__n);
  }
  if (uVar1 < BitWidth) {
    llvm::APInt::zext((APInt *)&local_48,(uint)rotateAmt);
    llvm::APInt::operator=((APInt *)&local_58,(APInt *)&local_48);
    if ((0x40 < local_40) && ((void *)local_48.VAL != (void *)0x0)) {
      operator_delete__(local_48.pVal);
    }
  }
  llvm::APInt::APInt((APInt *)&local_38,local_50,(ulong)BitWidth,false);
  llvm::APInt::urem((APInt *)&local_48,(APInt *)&local_58);
  llvm::APInt::operator=((APInt *)&local_58,(APInt *)&local_48);
  if ((0x40 < local_40) && ((void *)local_48.VAL != (void *)0x0)) {
    operator_delete__(local_48.pVal);
  }
  if ((0x40 < local_30) && ((void *)local_38.VAL != (void *)0x0)) {
    operator_delete__(local_38.pVal);
  }
  bVar2 = llvm::APInt::ugt((APInt *)&local_58,(ulong)BitWidth);
  if (!bVar2) {
    uVar3 = llvm::APInt::getZExtValue((APInt *)&local_58);
    BitWidth = (uint)uVar3;
  }
  if ((0x40 < local_50) && (local_58.VAL != 0)) {
    operator_delete__(local_58.pVal);
  }
  return BitWidth;
}

Assistant:

static unsigned rotateModulo(unsigned BitWidth, const APInt &rotateAmt) {
  unsigned rotBitWidth = rotateAmt.getBitWidth();
  APInt rot = rotateAmt;
  if (rotBitWidth < BitWidth) {
    // Extend the rotate APInt, so that the urem doesn't divide by 0.
    // e.g. APInt(1, 32) would give APInt(1, 0).
    rot = rotateAmt.zext(BitWidth);
  }
  rot = rot.urem(APInt(rot.getBitWidth(), BitWidth));
  return rot.getLimitedValue(BitWidth);
}